

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall
Solver_MCSVM_CS::solve_sub_problem
          (Solver_MCSVM_CS *this,double A_i,int yi,double C_yi,int active_i,double *alpha_new)

{
  double *pdVar1;
  int iVar2;
  double *__dest;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __nmemb;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pdVar1 = this->B;
  __nmemb = (size_t)active_i;
  uVar5 = 0xffffffffffffffff;
  if (-1 < active_i) {
    uVar5 = __nmemb * 8;
  }
  __dest = (double *)operator_new__(uVar5);
  memcpy(__dest,pdVar1,__nmemb * 8);
  if (yi < active_i) {
    __dest[yi] = __dest[yi] + A_i * C_yi;
  }
  qsort(__dest,__nmemb,8,compare_double);
  dVar6 = *__dest - A_i * C_yi;
  iVar2 = 1;
  if (1 < active_i) {
    iVar2 = active_i;
  }
  for (lVar3 = 1; lVar3 < (long)__nmemb; lVar3 = lVar3 + 1) {
    dVar7 = (double)(int)lVar3;
    if (__dest[lVar3] * dVar7 <= dVar6) goto LAB_0010431f;
    dVar6 = dVar6 + __dest[lVar3];
  }
  dVar7 = (double)iVar2;
LAB_0010431f:
  pdVar1 = this->B;
  uVar4 = 0;
  uVar5 = (ulong)(uint)active_i;
  if (active_i < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    dVar8 = C_yi;
    if ((uint)yi != uVar4) {
      dVar8 = 0.0;
    }
    dVar9 = (dVar6 / dVar7 - pdVar1[uVar4]) / A_i;
    if (dVar9 <= dVar8) {
      dVar8 = dVar9;
    }
    alpha_new[uVar4] = dVar8;
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void Solver_MCSVM_CS::solve_sub_problem(double A_i, int yi, double C_yi, int active_i, double *alpha_new)
{
	int r;
	double *D;

	clone(D, B, active_i);
	if(yi < active_i)
		D[yi] += A_i*C_yi;
	qsort(D, active_i, sizeof(double), compare_double);

	double beta = D[0] - A_i*C_yi;
	for(r=1;r<active_i && beta<r*D[r];r++)
		beta += D[r];
	beta /= r;

	for(r=0;r<active_i;r++)
	{
		if(r == yi)
			alpha_new[r] = min(C_yi, (beta-B[r])/A_i);
		else
			alpha_new[r] = min((double)0, (beta - B[r])/A_i);
	}
	delete[] D;
}